

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::Impl::StdString::StartsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,StartsWith *this)

{
  size_type *psVar1;
  Choice CVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong *local_78;
  long local_70;
  ulong local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"starts with: \"",&(this->m_data).m_str);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_68 = *puVar6;
    uStack_60 = (undefined4)plVar4[3];
    uStack_5c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar6;
    local_78 = (ulong *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  CVar2 = (this->m_data).m_caseSensitivity;
  pcVar8 = "";
  if (CVar2 == No) {
    pcVar8 = " (case insensitive)";
  }
  pcVar7 = pcVar8 + 0x13;
  if (CVar2 != No) {
    pcVar7 = pcVar8;
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar8,pcVar7);
  uVar9 = 0xf;
  if (local_78 != &local_68) {
    uVar9 = local_68;
  }
  if (uVar9 < (ulong)(local_50 + local_70)) {
    uVar9 = 0xf;
    if (local_58 != local_48) {
      uVar9 = local_48[0];
    }
    if ((ulong)(local_50 + local_70) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_00115e9d;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
LAB_00115e9d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "starts with: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }